

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::outputIndexes(TasgridWrapper *this,output_points_mode mode)

{
  int cols;
  int new_num_strips;
  long lVar1;
  long lVar2;
  Data2D<double> pv;
  Data2D<double> DStack_48;
  
  if (mode == needed) {
    lVar1 = TasGrid::TasmanianSparseGrid::getNeededIndexes();
    if (*(long *)&this->field_0x8 == 0) {
      new_num_strips = 0;
    }
    else {
      new_num_strips = *(int *)(*(long *)&this->field_0x8 + 0x48);
    }
  }
  else {
    lVar1 = TasGrid::TasmanianSparseGrid::getPointsIndexes();
    new_num_strips = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  }
  TasGrid::Data2D<double>::Data2D<int,int>(&DStack_48,this->num_dimensions,new_num_strips);
  cols = this->num_dimensions;
  for (lVar2 = 0; (long)new_num_strips * (long)cols * 4 != lVar2; lVar2 = lVar2 + 4) {
    *(double *)
     ((long)DStack_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2 * 2) = (double)*(int *)(lVar1 + lVar2);
  }
  writeMatrix(this,&this->outfilename,new_num_strips,cols,
              DStack_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  printMatrix(this,new_num_strips,this->num_dimensions,
              DStack_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,false);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&DStack_48.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasgridWrapper::outputIndexes(output_points_mode mode) const{
    const int *p = (mode == output_points_mode::needed) ? grid.getNeededIndexes() : grid.getPointsIndexes();
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    Data2D<double> pv(num_dimensions, num_points);
    std::transform(p, p + Utils::size_mult(num_points, num_dimensions), pv.getStrip(0), [](int i)->double{ return double(i); });

    writeMatrix(outfilename, num_points, num_dimensions, pv.getStrip(0));
    printMatrix(num_points, num_dimensions, pv.getStrip(0));
}